

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

size_t xm_get_memory_needed_for_context(char *moddata,size_t moddata_length)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  short sVar8;
  uint uVar9;
  uint uVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ushort local_3c;
  
  if (moddata_length < 0x45) {
    bVar1 = 0;
    uVar3 = 0;
LAB_0010302c:
    uVar9 = 0;
  }
  else {
    uVar3 = (uint)(byte)moddata[0x44];
    if (moddata_length == 0x45) {
LAB_0010302a:
      bVar1 = 0;
      goto LAB_0010302c;
    }
    uVar3 = (uint)CONCAT11(moddata[0x45],moddata[0x44]);
    if (moddata_length < 0x47) goto LAB_0010302a;
    bVar1 = moddata[0x46];
    if (moddata_length == 0x47) goto LAB_0010302c;
    uVar9 = (uint)(byte)moddata[0x47] << 8;
  }
  if (moddata_length < 0x49) {
    uVar6 = 0;
LAB_00103061:
    uVar13 = 0;
  }
  else {
    uVar6 = (uint)(byte)moddata[0x48];
    if (moddata_length == 0x49) goto LAB_00103061;
    uVar13 = (uint)(byte)moddata[0x49] << 8;
  }
  if (moddata_length < 0x41) {
    bVar14 = 0;
LAB_00103092:
    uVar7 = 0;
  }
  else {
    bVar14 = moddata[0x40];
    if (moddata_length == 0x41) goto LAB_00103092;
    uVar7 = (uint)(byte)moddata[0x41] << 8;
  }
  if (moddata_length < 0x3d) {
    uVar5 = 0;
    uVar17 = 0;
  }
  else {
    uVar17 = (ulong)(byte)moddata[0x3c];
    if (moddata_length != 0x3d) {
      uVar17 = (ulong)CONCAT11(moddata[0x3d],moddata[0x3c]);
      if (0x3e < moddata_length) {
        uVar5 = (uint)(byte)moddata[0x3e];
        if (moddata_length != 0x3f) {
          uVar10 = (uint)(byte)moddata[0x3f] << 8;
          goto LAB_001030df;
        }
        goto LAB_001030dc;
      }
    }
    uVar5 = 0;
  }
LAB_001030dc:
  uVar10 = 0;
LAB_001030df:
  lVar2 = (ulong)(uVar13 | uVar6) * 0xf8 + (ulong)((uVar9 | bVar1) << 4) +
          (ulong)((uVar7 | bVar14) << 8);
  uVar17 = ((uVar10 | uVar5) << 0x10) + uVar17 + 0x3c;
  uVar9 = bVar1 | uVar9;
  while (sVar8 = (short)uVar9, uVar9 = (uint)(ushort)(sVar8 - 1), sVar8 != 0) {
    if (uVar17 + 5 < moddata_length) {
      uVar16 = (ulong)(byte)moddata[uVar17 + 5];
    }
    else {
      uVar16 = 0;
    }
    if (uVar17 + 6 < moddata_length) {
      uVar19 = (ulong)(byte)moddata[uVar17 + 6] << 8;
    }
    else {
      uVar19 = 0;
    }
    if (uVar17 < moddata_length) {
      uVar7 = (uint)(byte)moddata[uVar17];
    }
    else {
      uVar7 = 0;
    }
    if (uVar17 + 1 < moddata_length) {
      uVar5 = (uint)(byte)moddata[uVar17 + 1] << 8;
    }
    else {
      uVar5 = 0;
    }
    if (uVar17 + 2 < moddata_length) {
      uVar10 = (uint)(byte)moddata[uVar17 + 2];
    }
    else {
      uVar10 = 0;
    }
    if (uVar17 + 3 < moddata_length) {
      uVar18 = (uint)(byte)moddata[uVar17 + 3] << 8;
    }
    else {
      uVar18 = 0;
    }
    if (uVar17 + 7 < moddata_length) {
      uVar4 = (uint)(byte)moddata[uVar17 + 7];
    }
    else {
      uVar4 = 0;
    }
    if (uVar17 + 8 < moddata_length) {
      iVar15 = (uint)(byte)moddata[uVar17 + 8] << 8;
    }
    else {
      iVar15 = 0;
    }
    lVar2 = lVar2 + (uVar19 | uVar16) * (ulong)uVar3 * 5;
    uVar17 = uVar17 + (iVar15 + uVar4 + ((uVar18 | uVar10) << 0x10 | uVar5 | uVar7));
  }
  local_3c = (ushort)uVar6;
  for (uVar12 = 0; uVar12 != (ushort)(local_3c | (ushort)uVar13); uVar12 = uVar12 + 1) {
    if (uVar17 + 0x1b < moddata_length) {
      uVar11 = (ushort)(byte)moddata[uVar17 + 0x1b];
    }
    else {
      uVar11 = 0;
    }
    uVar6 = 0;
    uVar9 = 0;
    if (uVar17 + 0x1c < moddata_length) {
      uVar9 = (uint)(byte)moddata[uVar17 + 0x1c] << 8;
    }
    if (uVar17 < moddata_length) {
      uVar6 = (uint)(byte)moddata[uVar17];
    }
    uVar7 = 0;
    uVar5 = 0;
    if (uVar17 + 1 < moddata_length) {
      uVar5 = (uint)(byte)moddata[uVar17 + 1] << 8;
    }
    if (uVar17 + 2 < moddata_length) {
      uVar7 = (uint)(byte)moddata[uVar17 + 2];
    }
    uVar10 = 0;
    uVar18 = 0;
    if (uVar17 + 3 < moddata_length) {
      uVar18 = (uint)(byte)moddata[uVar17 + 3] << 8;
    }
    lVar2 = lVar2 + (ulong)(uVar9 | uVar11) * 0x38;
    uVar18 = (uVar18 | uVar7) * 0x10000;
    uVar7 = uVar5 | uVar6 | uVar18;
    if (((uVar5 | uVar6) + uVar18) - 0x108 < 0xfffffef9) {
      uVar7 = 0x107;
    }
    uVar17 = uVar17 + uVar7;
    uVar9 = uVar9 | uVar11;
    while (sVar8 = (short)uVar9, uVar9 = (uint)(ushort)(sVar8 - 1), sVar8 != 0) {
      uVar6 = 0;
      uVar7 = 0;
      if (uVar17 < moddata_length) {
        uVar7 = (uint)(byte)moddata[uVar17];
      }
      if (uVar17 + 1 < moddata_length) {
        uVar6 = (uint)(byte)moddata[uVar17 + 1] << 8;
      }
      uVar5 = 0;
      uVar18 = 0;
      if (uVar17 + 2 < moddata_length) {
        uVar18 = (uint)(byte)moddata[uVar17 + 2];
      }
      if (uVar17 + 3 < moddata_length) {
        uVar5 = (uint)(byte)moddata[uVar17 + 3] << 8;
      }
      uVar6 = (uVar5 | uVar18) << 0x10 | uVar6 | uVar7;
      uVar10 = uVar10 + uVar6;
      lVar2 = lVar2 + (ulong)uVar6;
      uVar17 = uVar17 + 0x28;
    }
    uVar17 = uVar17 + uVar10;
  }
  return lVar2 + (ulong)uVar3 * 0x138 + 0x170;
}

Assistant:

size_t xm_get_memory_needed_for_context(const char* moddata, size_t moddata_length) {
	size_t memory_needed = 0;
	size_t offset = 60; /* Skip the first header */
	uint16_t num_channels;
	uint16_t num_patterns;
	uint16_t num_instruments;

	/* Read the module header */

	num_channels = READ_U16(offset + 8);
	num_patterns = READ_U16(offset + 10);
	memory_needed += num_patterns * sizeof(xm_pattern_t);

	num_instruments = READ_U16(offset + 12);
	memory_needed += num_instruments * sizeof(xm_instrument_t);

	memory_needed += MAX_NUM_ROWS * READ_U16(offset + 4) * sizeof(uint8_t); /* Module length */

	/* Header size */
	offset += READ_U32(offset);

	/* Read pattern headers */
	for(uint16_t i = 0; i < num_patterns; ++i) {
		uint16_t num_rows;

		num_rows = READ_U16(offset + 5);
		memory_needed += num_rows * num_channels * sizeof(xm_pattern_slot_t);

		/* Pattern header length + packed pattern data size */
		offset += READ_U32(offset) + READ_U16(offset + 7);
	}

	/* Read instrument headers */
	for(uint16_t i = 0; i < num_instruments; ++i) {
		uint16_t num_samples;
		uint32_t sample_size_aggregate = 0;

		num_samples = READ_U16(offset + 27);
		memory_needed += num_samples * sizeof(xm_sample_t);

		/* Instrument header size */
		uint32_t ins_header_size = READ_U32(offset);
		if (ins_header_size == 0 || ins_header_size > INSTRUMENT_HEADER_LENGTH)
			ins_header_size = INSTRUMENT_HEADER_LENGTH;
		offset += ins_header_size;

		for(uint16_t j = 0; j < num_samples; ++j) {
			uint32_t sample_size;

			sample_size = READ_U32(offset);
			sample_size_aggregate += sample_size;
			memory_needed += sample_size;
			offset += 40; /* See comment in xm_load_module() */
		}

		offset += sample_size_aggregate;
	}

	memory_needed += num_channels * sizeof(xm_channel_context_t);
	memory_needed += sizeof(xm_context_t);

	return memory_needed;
}